

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
mxx::impl::
sample_block_decomp<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,impl *this,
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          begin,size_type end,comm *param_5,comm *param_6)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference __p;
  reference pvVar5;
  iterator iVar6;
  iterator iVar7;
  reference pvVar8;
  allocator<unsigned_long> local_d9;
  value_type_conflict local_d8;
  undefined1 local_d0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  value_type my_splitter;
  size_t bucket_size;
  size_t i;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  pos;
  allocator<std::pair<int,_int>_> local_69;
  undefined1 local_68 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_splitters;
  size_t local_size;
  comm *comm_local;
  size_t s_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  end_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  begin_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *result_splitters;
  
  local_splitters.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = begin._M_current;
  uVar3 = std::
          distance<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                    ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      )this,begin);
  if (uVar3 == 0) {
    assert_fail("local_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                ,0xa1,"sample_block_decomp");
  }
  std::allocator<std::pair<int,_int>_>::allocator(&local_69);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_68,end,
             &local_69);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_69);
  i = (size_t)this;
  for (bucket_size = 0;
      sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         local_68), bucket_size < sVar4; bucket_size = bucket_size + 1) {
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator+=((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  *)&i,uVar3 / (end + 1) + (long)(int)(uint)(bucket_size < uVar3 % (end + 1)) + -1);
    __p = __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       *)&i);
    pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_68,bucket_size);
    std::pair<int,_int>::operator=(pvVar5,__p);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  *)&i);
  }
  iVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_68)
  ;
  iVar7 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_68)
  ;
  bitonic_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
            (iVar6._M_current,iVar7._M_current,param_5);
  pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::back
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_68
                     );
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)pvVar5;
  iVar1 = mxx::comm::size(param_5);
  local_d8 = 1;
  std::allocator<unsigned_long>::allocator(&local_d9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,(long)iVar1,&local_d8
             ,&local_d9);
  std::allocator<unsigned_long>::~allocator(&local_d9);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
  *pvVar8 = 0;
  iVar1 = mxx::comm::rank(param_5);
  iVar2 = mxx::comm::size(param_5);
  allgatherv<std::pair<int,int>>
            (__return_storage_ptr__,
             (mxx *)&recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
             (pair<int,_int> *)(ulong)(iVar1 + 1 < iVar2),(size_t)local_d0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)param_5,param_6);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_block_decomp(_Iterator begin, _Iterator end, _Compare comp, size_t s, const mxx::comm& comm) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    size_t local_size = std::distance(begin, end);
    MXX_ASSERT(local_size > 0);

    // 1. samples
    //  - pick `s` samples equally spaced such that `s` samples define `s+1`
    //    subsequences in the sorted order
    std::vector<value_type> local_splitters(s);
    _Iterator pos = begin;
    for (size_t i = 0; i < local_splitters.size(); ++i) {
        size_t bucket_size = local_size / (s+1) + (i < (local_size % (s+1)) ? 1 : 0);
        // pick last element of each bucket
        pos += (bucket_size-1);
        local_splitters[i] = *pos;
        ++pos;
    }

    // sort splitters using parallel bitonic sort
    bitonic_sort(local_splitters.begin(), local_splitters.end(), comp, comm);

    // select the last element on each process but the last
    value_type my_splitter = local_splitters.back();
    // allgather splitters (from all but the last processor)
    std::vector<size_t> recv_sizes(comm.size(), 1);
    recv_sizes.back() = 0;
    std::vector<value_type> result_splitters = mxx::allgatherv(&my_splitter, (comm.rank() + 1 < comm.size()) ? 1 : 0, recv_sizes, comm);

    // return resulting splitters
    return result_splitters;
}